

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit_reporter.h
# Opt level: O3

void __thiscall bandit::detail::xunit_reporter::it_skip(xunit_reporter *this,char *desc)

{
  int *piVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  allocator local_69;
  string local_68;
  string local_48;
  
  piVar1 = &(this->super_progress_reporter).specs_skipped_;
  *piVar1 = *piVar1 + 1;
  puVar2 = &this->field_0x80;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar2,"\t<testcase classname=\"",0x16);
  progress_reporter::current_context_name_abi_cxx11_(&local_48,&this->super_progress_reporter);
  escape(&local_68,this,&local_48);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"name=\"",6);
  std::__cxx11::string::string((string *)&local_48,desc,&local_69);
  escape(&local_68,this,&local_48);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" time=\"0\">\n",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"\t\t<skipped />\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"\t</testcase>\n",0xd);
  return;
}

Assistant:

void it_skip(const char* desc)
    {
      progress_reporter::it_skip(desc);
      work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
      work_stm_ << "name=\"" << escape(desc) << "\" time=\"0\">\n";
      work_stm_ << "\t\t<skipped />\n";
      work_stm_ << "\t</testcase>\n";
    }